

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::ParquetMetaDataInit<(duckdb::ParquetMetadataOperatorType)0>
          (duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  vector<duckdb::LogicalType,_true> *types;
  FunctionData *pFVar1;
  ParquetMetaDataOperatorData *this_00;
  MultiFileList *pMVar2;
  pointer pPVar3;
  pointer pPVar4;
  pointer *__ptr;
  shared_ptr<duckdb::MultiFileList,_true> *this_01;
  _Head_base<0UL,_duckdb::ParquetMetaDataOperatorData_*,_false> local_68;
  OpenFileInfo local_60;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  pFVar1 = (input->bind_data).ptr;
  types = (vector<duckdb::LogicalType,_true> *)(pFVar1 + 4);
  this_00 = (ParquetMetaDataOperatorData *)operator_new(0x130);
  ParquetMetaDataOperatorData::ParquetMetaDataOperatorData(this_00,context,types);
  this_01 = (shared_ptr<duckdb::MultiFileList,_true> *)(pFVar1 + 7);
  local_68._M_head_impl = this_00;
  pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator->(this_01);
  pPVar3 = unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                         *)&local_68);
  MultiFileList::InitializeScan(pMVar2,&pPVar3->file_list_scan);
  pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator->(this_01);
  pPVar3 = unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                         *)&local_68);
  pPVar4 = unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                         *)&local_68);
  MultiFileList::Scan(pMVar2,&pPVar3->file_list_scan,&pPVar4->current_file);
  pPVar3 = unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
                         *)&local_68);
  pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator->(this_01);
  MultiFileList::GetFirstFile(&local_60,pMVar2);
  ParquetMetaDataOperatorData::LoadRowGroupMetadata(pPVar3,context,types,&local_60);
  if (local_60.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.extended_info.internal.
               super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.path._M_dataplus._M_p != &local_60.path.field_2) {
    operator_delete(local_60.path._M_dataplus._M_p);
  }
  *(ParquetMetaDataOperatorData **)this = local_68._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this;
}

Assistant:

unique_ptr<GlobalTableFunctionState> ParquetMetaDataInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<ParquetMetaDataBindData>();

	auto result = make_uniq<ParquetMetaDataOperatorData>(context, bind_data.return_types);

	bind_data.file_list->InitializeScan(result->file_list_scan);
	bind_data.file_list->Scan(result->file_list_scan, result->current_file);

	D_ASSERT(!bind_data.file_list->IsEmpty());

	switch (TYPE) {
	case ParquetMetadataOperatorType::SCHEMA:
		result->LoadSchemaData(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::META_DATA:
		result->LoadRowGroupMetadata(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
		result->LoadKeyValueMetaData(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::FILE_META_DATA:
		result->LoadFileMetaData(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::BLOOM_PROBE: {
		auto &bloom_probe_bind_data = input.bind_data->Cast<ParquetBloomProbeBindData>();
		result->ExecuteBloomProbe(context, bind_data.return_types, bind_data.file_list->GetFirstFile(),
		                          bloom_probe_bind_data.probe_column_name, bloom_probe_bind_data.probe_constant);
		break;
	}
	default:
		throw InternalException("Unsupported ParquetMetadataOperatorType");
	}

	return std::move(result);
}